

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pMVar3;
  TextAttributes local_a8;
  Text local_88;
  
  if ((this->messageLabel)._M_string_length != 0) {
    poVar2 = std::operator<<(this->stream,(string *)&this->messageLabel);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,"\n");
  }
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar3 = (this->messages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    poVar2 = this->stream;
    local_a8.initialIndent = 0xffffffffffffffff;
    local_a8.width = 0x4f;
    local_a8.tabChar = '\t';
    local_a8.indent = 2;
    Text::Text(&local_88,&pMVar3->message,&local_a8);
    operator<<(poVar2,&local_88);
    std::operator<<(poVar2,"\n");
    Text::~Text(&local_88);
  }
  return;
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }